

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export_compilation.cpp
# Opt level: O2

void pstore::exchange::export_ns::emit_compilation_index
               (ostream_base *os,indent ind,database *db,uint generation,string_mapping *strings,
               bool comments)

{
  bool bVar1;
  uint uVar2;
  typed_address<pstore::trailer> tVar3;
  bool comments_local;
  indent ind_local;
  shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
  compilations;
  database *local_80;
  element_type *local_78;
  long local_70;
  anon_class_56_7_4f9db7a2 out_fn;
  char *sep;
  
  comments_local = comments;
  ind_local = ind;
  pstore::index::
  get_index<(pstore::trailer::indices)0,pstore::database_const,pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>const>
            ((index *)&compilations,db,true);
  if (compilations.
      super___shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0) {
    bVar1 = pstore::index::
            hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
            ::empty(compilations.
                    super___shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr);
    if (generation != 0 && !bVar1) {
      out_fn.sep = &sep;
      sep = "\n";
      out_fn.ind = &ind_local;
      out_fn.comments = &comments_local;
      out_fn.compilations = &compilations;
      out_fn.db = db;
      out_fn.os = os;
      out_fn.strings = strings;
      uVar2 = database::get_current_revision(db);
      if (generation - 1 <= uVar2) {
        tVar3 = database::older_revision_footer_pos(db,generation - 1);
        local_70 = (long)tVar3.a_.a_ + 0x70;
        local_78 = compilations.
                   super___shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
        local_80 = db;
        if (((compilations.
              super___shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->root_).internal_ != (internal_node *)0x0) {
          diff_details::
          traverser<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
          ::
          visit_node<pstore::exchange::export_ns::diff_out<pstore::exchange::export_ns::emit_compilation_index(pstore::exchange::export_ns::ostream_base&,pstore::exchange::export_ns::indent,pstore::database_const&,unsigned_int,pstore::exchange::export_ns::string_mapping_const&,bool)::__0>>
                    ((traverser<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
                      *)&local_80,
                     (compilations.
                      super___shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->root_,0,&out_fn);
        }
      }
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&compilations.
              super___shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void emit_compilation_index (ostream_base & os, indent const ind, database const & db,
                                         unsigned const generation, string_mapping const & strings,
                                         bool const comments) {
                auto const compilations = index::get_index<trailer::indices::compilation> (db);
                if (!compilations || compilations->empty ()) {
                    return;
                }
                if (generation == 0) {
                    // The first (zeroth) transaction in the store is, by definition, empty.
                    return;
                }
                auto const * sep = "\n";

                auto const out_fn = [&] (address const addr) {
                    auto const & kvp = compilations->load_leaf_node (db, addr);
                    os << sep << ind;
                    emit_digest (os, kvp.first);
                    os << ':';
                    emit_compilation (os, ind, db, *db.getro (kvp.second), strings, comments);
                    sep = ",\n";
                };
                diff (db, *compilations, generation - 1U, make_diff_out (&out_fn));
            }